

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.cpp
# Opt level: O1

void CaDiCaL::Options::initialize_from_environment(int *val,char *name,int L,int H)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  long lVar4;
  undefined1 *puVar5;
  char *pcVar6;
  char key [80];
  char local_78 [8];
  undefined1 auStack_70 [72];
  
  cVar1 = 'C';
  lVar4 = 0;
  do {
    local_78[lVar4] = cVar1;
    cVar1 = "CADICAL_"[lVar4 + 1];
    lVar4 = lVar4 + 1;
  } while (lVar4 != 8);
  puVar5 = auStack_70;
  cVar1 = *name;
  if (cVar1 != '\0') {
    pcVar6 = name + 1;
    do {
      iVar3 = toupper((int)cVar1);
      *puVar5 = (char)iVar3;
      puVar5 = puVar5 + 1;
      cVar1 = *pcVar6;
      pcVar6 = pcVar6 + 1;
    } while (cVar1 != '\0');
  }
  *puVar5 = 0;
  pcVar6 = getenv(local_78);
  if (pcVar6 != (char *)0x0) {
    bVar2 = parse_int_str(pcVar6,val);
    if (bVar2) {
      if (*val < L) {
        *val = L;
      }
      if (H < *val) {
        *val = H;
      }
    }
  }
  return;
}

Assistant:

void Options::initialize_from_environment (int &val, const char *name,
                                           const int L, const int H) {
  char key[80], *q;
  const char *p;
  assert (strlen (name) + strlen ("CADICAL_") + 1 < sizeof (key));
  for (p = "CADICAL_", q = key; *p; p++)
    *q++ = *p;
  for (p = name; *p; p++)
    *q++ = toupper (*p);
  assert (q < key + sizeof (key));
  *q = 0;
  const char *val_str = getenv (key);
  if (!val_str)
    return;
  if (!parse_int_str (val_str, val))
    return;
  if (val < L)
    val = L;
  if (val > H)
    val = H;
}